

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleIni.h
# Opt level: O0

int __thiscall
CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetSectionSize
          (CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this,char *a_pSection)

{
  const_iterator a_pLeft;
  bool bVar1;
  pointer ppVar2;
  size_type sVar3;
  pointer ppVar4;
  multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
  *this_00;
  _Self local_78;
  int local_6c;
  const_iterator cStack_68;
  int n;
  const_iterator iKeyVal;
  char *pLastKey;
  int nCount;
  TKeyVal *section;
  Entry local_40;
  _Self local_28;
  const_iterator iSection;
  char *a_pSection_local;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> *this_local;
  
  if (a_pSection == (char *)0x0) {
    this_local._4_4_ = -1;
  }
  else {
    iSection._M_node = (_Base_ptr)a_pSection;
    Entry::Entry(&local_40,a_pSection,0);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>_>
         ::find(&this->m_data,&local_40);
    section = (TKeyVal *)
              std::
              map<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>_>
              ::end(&this->m_data);
    bVar1 = std::operator==(&local_28,(_Self *)&section);
    if (bVar1) {
      this_local._4_4_ = -1;
    }
    else {
      ppVar2 = std::
               _Rb_tree_const_iterator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>_>_>
               ::operator->(&local_28);
      this_00 = &ppVar2->second;
      if (((this->m_bAllowMultiKey & 1U) == 0) ||
         (bVar1 = std::
                  multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
                  ::empty(this_00), bVar1)) {
        sVar3 = std::
                multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
                ::size(this_00);
        this_local._4_4_ = (int)sVar3;
      }
      else {
        pLastKey._4_4_ = 0;
        iKeyVal._M_node = (_Base_ptr)0x0;
        cStack_68 = std::
                    multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
                    ::begin(this_00);
        local_6c = 0;
        while( true ) {
          local_78._M_node =
               (_Base_ptr)
               std::
               multimap<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*,_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry::KeyOrder,_std::allocator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>_>
               ::end(this_00);
          bVar1 = std::operator!=(&stack0xffffffffffffff98,&local_78);
          a_pLeft = iKeyVal;
          if (!bVar1) break;
          if (iKeyVal._M_node == (_Base_ptr)0x0) {
LAB_0019191f:
            pLastKey._4_4_ = pLastKey._4_4_ + 1;
            ppVar4 = std::
                     _Rb_tree_const_iterator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>
                     ::operator->(&stack0xffffffffffffff98);
            iKeyVal._M_node = (_Base_ptr)(ppVar4->first).pItem;
          }
          else {
            ppVar4 = std::
                     _Rb_tree_const_iterator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>
                     ::operator->(&stack0xffffffffffffff98);
            bVar1 = IsLess(this,(char *)a_pLeft._M_node,(ppVar4->first).pItem);
            if (bVar1) goto LAB_0019191f;
          }
          std::
          _Rb_tree_const_iterator<std::pair<const_CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_const_char_*>_>
          ::operator++(&stack0xffffffffffffff98);
          local_6c = local_6c + 1;
        }
        this_local._4_4_ = pLastKey._4_4_;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

int CSimpleIniTempl<SI_CHAR, SI_STRLESS, SI_CONVERTER>::GetSectionSize(const SI_CHAR *a_pSection) const {
	if (!a_pSection) {
		return -1;
	}

	typename TSection::const_iterator iSection = m_data.find(a_pSection);
	if (iSection == m_data.end()) {
		return -1;
	}
	const TKeyVal &section = iSection->second;

	// if multi-key isn't permitted then the section size is
	// the number of keys that we have.
	if (!m_bAllowMultiKey || section.empty()) {
		return (int)section.size();
	}

	// otherwise we need to count them
	int nCount = 0;
	const SI_CHAR *pLastKey = NULL;
	typename TKeyVal::const_iterator iKeyVal = section.begin();
	for (int n = 0; iKeyVal != section.end(); ++iKeyVal, ++n) {
		if (!pLastKey || IsLess(pLastKey, iKeyVal->first.pItem)) {
			++nCount;
			pLastKey = iKeyVal->first.pItem;
		}
	}
	return nCount;
}